

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray_&,_const_char_(&)[15]>,_QByteArray>,_const_char_(&)[6]>,_QByteArray>
::convertTo<QByteArray>
          (QByteArray *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray_&,_const_char_(&)[15]>,_QByteArray>,_const_char_(&)[6]>,_QByteArray>
          *this)

{
  char cVar1;
  char *__dest;
  QByteArray *pQVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *size;
  
  QByteArray::isNull((this->a).a.a.a);
  size = (char *)((this->b).d.size + (((this->a).a.a.a)->d).size + (this->a).a.b.d.size + 0x13);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,(qsizetype)size,Uninitialized);
  __dest = (__return_storage_ptr__->d).ptr;
  pQVar2 = (this->a).a.a.a;
  sVar3 = (pQVar2->d).size;
  if (sVar3 != 0) {
    memcpy(__dest,(pQVar2->d).ptr,sVar3);
  }
  pcVar5 = __dest + sVar3;
  pcVar4 = *(this->a).a.a.b;
  cVar1 = *pcVar4;
  while (cVar1 != '\0') {
    pcVar4 = pcVar4 + 1;
    *pcVar5 = cVar1;
    pcVar5 = pcVar5 + 1;
    cVar1 = *pcVar4;
  }
  sVar3 = (this->a).a.b.d.size;
  if (sVar3 != 0) {
    memcpy(pcVar5,(this->a).a.b.d.ptr,sVar3);
  }
  pcVar5 = pcVar5 + sVar3;
  pcVar4 = *(this->a).b;
  cVar1 = *pcVar4;
  while (cVar1 != '\0') {
    pcVar4 = pcVar4 + 1;
    *pcVar5 = cVar1;
    pcVar5 = pcVar5 + 1;
    cVar1 = *pcVar4;
  }
  sVar3 = (this->b).d.size;
  if (sVar3 != 0) {
    memcpy(pcVar5,(this->b).d.ptr,sVar3);
  }
  if (size != pcVar5 + (sVar3 - (long)__dest)) {
    QByteArray::resize(__return_storage_ptr__,(qsizetype)(pcVar5 + (sVar3 - (long)__dest)));
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }